

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O0

void test_contains_all_different_sizes(void)

{
  bitset_t *b1;
  bitset_t *bitset;
  bitset_t *subset;
  bitset_t *superset;
  size_t subset_size;
  size_t superset_size;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  unsigned_long result;
  
  result = 5;
  b1 = bitset_create_with_capacity(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bitset = bitset_create_with_capacity
                     (CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bitset_set(bitset,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bitset_set(bitset,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bitset_set(bitset,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bitset_set(bitset,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bitset_set(bitset,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bitset_contains_all(b1,bitset);
  _assert_true(result,(char *)b1,(char *)bitset,in_stack_ffffffffffffffdc);
  bitset_contains_all(b1,bitset);
  _assert_true(result,(char *)b1,(char *)bitset,in_stack_ffffffffffffffdc);
  bitset_free((bitset_t *)0x1035e8);
  bitset_free((bitset_t *)0x1035f2);
  return;
}

Assistant:

DEFINE_TEST(test_contains_all_different_sizes) {
    const size_t superset_size = 10;
    const size_t subset_size = 5;

    bitset_t *superset = bitset_create_with_capacity(superset_size);
    bitset_t *subset = bitset_create_with_capacity(subset_size);

    bitset_set(superset, 1);
    bitset_set(superset, subset_size - 1);
    bitset_set(superset, subset_size + 1);

    bitset_set(subset, 1);
    bitset_set(subset, subset_size - 1);

    assert_true(bitset_contains_all(superset, subset));
    assert_true(!bitset_contains_all(subset, superset));

    bitset_free(superset);
    bitset_free(subset);
}